

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::WATParser::TypeUse> *
wasm::WATParser::typeuse<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::TypeUse> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          bool allowNames)

{
  Lexer *this;
  optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> type;
  bool bVar1;
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
  *p_Var2;
  __index_type *params;
  undefined1 uVar3;
  __index_type *__rhs;
  string_view expected;
  string local_118;
  string local_f8 [32];
  uintptr_t local_d8;
  undefined8 uStack_d0;
  uintptr_t local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 auStack_b0 [8];
  MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> namedParams;
  undefined1 local_80 [8];
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> _val_2;
  MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> resultTypes;
  
  this = &ctx->in;
  namedParams.val.
  super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
  .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._32_8_ =
       (ctx->in).pos;
  expected._M_str = "type";
  expected._M_len = 4;
  bVar1 = Lexer::takeSExprStart(this,expected);
  if (bVar1) {
    typeidx<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                *)auStack_b0,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)((long)&_val_2.val.
                                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)auStack_b0);
    if (resultTypes.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x01') {
      std::__cxx11::string::string
                ((string *)local_80,
                 (string *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)
                 __return_storage_ptr__,local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
      bVar1 = Lexer::takeRParen(this);
      if (bVar1) {
        p_Var2 = (_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                  *)0x0;
        if (namedParams.val.
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
            _24_1_ == '\0') {
          p_Var2 = (_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                    *)auStack_b0;
        }
        local_d8 = (p_Var2->_M_u)._M_first._M_storage.type.id;
        uStack_d0 = *(undefined8 *)&(p_Var2->_M_u)._M_first._M_storage.exactness;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                             *)auStack_b0);
        uVar3 = 1;
        goto LAB_00c3c03d;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"expected end of type use",(allocator<char> *)local_80);
      Lexer::err((Err *)((long)&_val_2.val.
                                super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                .
                                super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                        + 0x20),this,&local_118);
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)
                 __return_storage_ptr__,
                 (__index_type *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_b0);
  }
  else {
    uVar3 = 0;
LAB_00c3c03d:
    params<wasm::WATParser::ParseModuleTypesCtx>
              ((MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *)
               auStack_b0,ctx,allowNames);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)((long)&_val_2.val.
                                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                       *)auStack_b0);
    if (resultTypes.val.
        super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_ ==
        '\x02') {
      std::__cxx11::string::string
                ((string *)local_80,
                 (string *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)
                 __return_storage_ptr__,local_80);
      std::__cxx11::string::~string((string *)local_80);
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
      results<wasm::WATParser::ParseModuleTypesCtx>
                ((MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> +
                 0x20),ctx);
      __rhs = (__index_type *)
              ((long)&_val_2.val.
                      super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                      .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err> + 0x20)
      ;
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)local_80,
                        (_Copy_ctor_base<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                         *)__rhs);
      if (_val_2.val.
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
          == '\x02') {
        std::__cxx11::string::string(local_f8,(string *)local_80);
        std::__detail::__variant::_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::TypeUse,wasm::Err> *)
                   __return_storage_ptr__,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)local_80);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                             *)local_80);
        local_c8 = local_d8;
        uStack_c0 = uStack_d0;
        params = auStack_b0;
        if (namedParams.val.
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>._M_u.
            _24_1_ != '\0') {
          params = (__index_type *)0x0;
        }
        if (resultTypes.val.
            super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>._M_u._24_1_
            != '\0') {
          __rhs = (__index_type *)0x0;
        }
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ._17_7_ = uStack_b7;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ._M_engaged = (bool)uVar3;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ._M_payload._8_8_ = uStack_d0;
        type.
        super__Optional_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_true,_true>
        ._M_payload.
        super__Optional_payload_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
        ._M_payload._M_value.type.id = (HeapType)(HeapType)local_d8;
        local_b8 = uVar3;
        ParseModuleTypesCtx::makeTypeUse
                  (__return_storage_ptr__,ctx,
                   namedParams.val.
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   _32_4_,type,(ParamsT *)params,(ResultsT *)__rhs);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::None,_wasm::Err>
                             + 0x20));
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         *)auStack_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}